

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O0

void __thiscall CSocekt::flyd_write_request_handler(CSocekt *this,lp_connection_t pConn)

{
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  int iVar1;
  LogLevel LVar2;
  Logger *this_00;
  long in_RSI;
  long in_RDI;
  ssize_t sendsize;
  CMemory *p_memory;
  Logger *in_stack_ffffffffffffbfe8;
  CMemory *in_stack_ffffffffffffbff0;
  Logger *in_stack_ffffffffffffbff8;
  SourceFile *in_stack_ffffffffffffc000;
  Logger *in_stack_ffffffffffffc020;
  ssize_t in_stack_ffffffffffffcff0;
  char *in_stack_ffffffffffffcff8;
  lp_connection_t in_stack_ffffffffffffd000;
  int in_stack_ffffffffffffd008;
  uint32_t in_stack_ffffffffffffd00c;
  uint32_t in_stack_ffffffffffffd010;
  int in_stack_ffffffffffffd014;
  CSocekt *in_stack_ffffffffffffd018;
  Logger local_2fd8;
  Logger local_1ff0;
  Logger local_ff8;
  ulong local_20;
  CMemory *local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = CMemory::GetInstance();
  local_20 = sendproc((CSocekt *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                      in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8,in_stack_ffffffffffffcff0)
  ;
  if (((long)local_20 < 1) || (local_20 == *(uint *)(local_10 + 0xf8))) {
    if (local_20 == 0xffffffffffffffff) {
      muduo::Logger::SourceFile::SourceFile<108>
                (in_stack_ffffffffffffc000,(char (*) [108])in_stack_ffffffffffffbff8);
      file._8_8_ = in_stack_ffffffffffffc000;
      file.data_ = (char *)in_stack_ffffffffffffbff8;
      muduo::Logger::Logger
                ((Logger *)in_stack_ffffffffffffbff0,file,
                 (int)((ulong)in_stack_ffffffffffffbfe8 >> 0x20),(LogLevel)in_stack_ffffffffffffbfe8
                );
      this_00 = (Logger *)muduo::Logger::stream(&local_ff8);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffffc000,(char *)in_stack_ffffffffffffbff8);
      muduo::Logger::~Logger(this_00);
    }
    else {
      if ((0 < (long)local_20) && (local_20 == *(uint *)(local_10 + 0xf8))) {
        iVar1 = flyd_epoll_oper_event
                          (in_stack_ffffffffffffd018,in_stack_ffffffffffffd014,
                           in_stack_ffffffffffffd010,in_stack_ffffffffffffd00c,
                           in_stack_ffffffffffffd008,in_stack_ffffffffffffd000);
        if (iVar1 == -1) {
          muduo::Logger::SourceFile::SourceFile<108>
                    (in_stack_ffffffffffffc000,(char (*) [108])in_stack_ffffffffffffbff8);
          file_00._8_8_ = in_stack_ffffffffffffc000;
          file_00.data_ = (char *)in_stack_ffffffffffffbff8;
          muduo::Logger::Logger
                    ((Logger *)in_stack_ffffffffffffbff0,file_00,
                     (int)((ulong)in_stack_ffffffffffffbfe8 >> 0x20),
                     (LogLevel)in_stack_ffffffffffffbfe8);
          muduo::Logger::stream(&local_1ff0);
          muduo::LogStream::operator<<
                    ((LogStream *)in_stack_ffffffffffffc000,(char *)in_stack_ffffffffffffbff8);
          muduo::Logger::~Logger(in_stack_ffffffffffffc020);
        }
        LVar2 = muduo::Logger::logLevel();
        if ((int)LVar2 < 3) {
          muduo::Logger::SourceFile::SourceFile<108>
                    (in_stack_ffffffffffffc000,(char (*) [108])in_stack_ffffffffffffbff8);
          in_stack_ffffffffffffbff8 = &local_2fd8;
          file_01._8_8_ = in_stack_ffffffffffffc000;
          file_01.data_ = (char *)in_stack_ffffffffffffbff8;
          muduo::Logger::Logger
                    ((Logger *)in_stack_ffffffffffffbff0,file_01,
                     (int)((ulong)in_stack_ffffffffffffbfe8 >> 0x20));
          in_stack_ffffffffffffc000 = (SourceFile *)muduo::Logger::stream(in_stack_ffffffffffffbff8)
          ;
          muduo::LogStream::operator<<
                    ((LogStream *)in_stack_ffffffffffffc000,(char *)in_stack_ffffffffffffbff8);
          muduo::Logger::~Logger(in_stack_ffffffffffffc020);
        }
      }
      iVar1 = sem_post((sem_t *)(in_RDI + 0x19c8));
      if (iVar1 == -1) {
        muduo::Logger::SourceFile::SourceFile<108>
                  (in_stack_ffffffffffffc000,(char (*) [108])in_stack_ffffffffffffbff8);
        in_stack_ffffffffffffbfe8 = (Logger *)&stack0xffffffffffffc040;
        file_02._8_8_ = in_stack_ffffffffffffc000;
        file_02.data_ = (char *)in_stack_ffffffffffffbff8;
        muduo::Logger::Logger
                  ((Logger *)in_stack_ffffffffffffbff0,file_02,
                   (int)((ulong)in_stack_ffffffffffffbfe8 >> 0x20),
                   (LogLevel)in_stack_ffffffffffffbfe8);
        in_stack_ffffffffffffbff0 = (CMemory *)muduo::Logger::stream(in_stack_ffffffffffffbfe8);
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffc000,(char *)in_stack_ffffffffffffbff8);
        muduo::Logger::~Logger(in_stack_ffffffffffffc020);
      }
      CMemory::FreeMemory(in_stack_ffffffffffffbff0,in_stack_ffffffffffffbfe8);
      *(undefined8 *)(local_10 + 0xe8) = 0;
      muduo::detail::AtomicIntegerT<int>::decrement((AtomicIntegerT<int> *)0x14126d);
    }
  }
  else {
    *(ulong *)(local_10 + 0xf0) = *(long *)(local_10 + 0xf0) + local_20;
    *(int *)(local_10 + 0xf8) = *(int *)(local_10 + 0xf8) - (int)local_20;
  }
  return;
}

Assistant:

void CSocekt::flyd_write_request_handler(lp_connection_t pConn)
{  
    CMemory *p_memory = CMemory::GetInstance();
    
    //这些代码的书写可以参照 void* CSocekt::ServerSendQueueThread(void* threadData)
    ssize_t sendsize = sendproc(pConn,pConn->psendbuf,pConn->isendlen);

    if(sendsize > 0 && sendsize != pConn->isendlen)
    {        
        //没有全部发送完毕，数据只发出去了一部分，那么发送到了哪里，剩余多少，继续记录，方便下次sendproc()时使用
        pConn->psendbuf = pConn->psendbuf + sendsize;
		pConn->isendlen = pConn->isendlen - sendsize;	
        return;
    }
    else if(sendsize == -1)
    {
        //这不太可能，可以发送数据时通知我发送数据，我发送时你却通知我发送缓冲区满？
        LOG_ERROR << "CSocekt::ngx_write_request_handler()时if(sendsize == -1)成立，这很怪异。";
        return;
    }

    if(sendsize > 0 && sendsize == pConn->isendlen) //成功发送完毕，做个通知是可以的；
    {
        //如果是成功的发送完毕数据，则把写事件通知从epoll中干掉吧；其他情况，那就是断线了，等着系统内核把连接从红黑树中干掉即可；
        if(flyd_epoll_oper_event(
                pConn->fd,          //socket句柄
                EPOLL_CTL_MOD,      //事件类型，这里是修改【因为我们准备减去写通知】
                EPOLLOUT,           //标志，这里代表要减去的标志,EPOLLOUT：可写【可写的时候通知我】
                1,                  //对于事件类型为增加的，EPOLL_CTL_MOD需要这个参数, 0：增加   1：去掉 2：完全覆盖
                pConn               //连接池中的连接
                ) == -1)
        {
            //有这情况发生？这可比较麻烦，不过先do nothing
            LOG_ERROR << "CSocekt::ngx_write_request_handler()时if(sendsize == -1)成立，这很怪异。";
        }    

            LOG_INFO << "flyd_write_request_handler数据发送完毕 ，很好！"  ;      
    }

    //能走下来的，要么数据发送完毕了，要么对端断开了，那么执行收尾工作吧；

    //数据发送完毕，或者把需要发送的数据干掉，都说明发送缓冲区可能有地方了，让发送线程往下走判断能否发送新数据
    if(sem_post(&m_semEventSendQueue)==-1)     
            LOG_ERROR << "CSocekt::ngx_write_request_handler()中sem_post(&m_semEventSendQueue)失败.";


    p_memory->FreeMemory(pConn->psendMemPointer);  //释放内存
    pConn->psendMemPointer = NULL;        
    pConn->iThrowsendCount.decrement();  //建议放在最后执行
    return;
}